

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O3

int SSL_SESSION_set1_id(SSL_SESSION *session,uint8_t *sid,size_t sid_len)

{
  int iVar1;
  
  if (sid_len < 0x21) {
    (session->session_id).size_ = '\0';
    if (sid_len != 0) {
      memmove(&session->session_id,sid,sid_len);
    }
    (session->session_id).size_ = (PackedSize<32UL>)sid_len;
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    ERR_put_error(0x10,0,0x122,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                  ,0x357);
  }
  return iVar1;
}

Assistant:

int SSL_SESSION_set1_id(SSL_SESSION *session, const uint8_t *sid,
                        size_t sid_len) {
  if (!session->session_id.TryCopyFrom(Span(sid, sid_len))) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SSL_SESSION_ID_TOO_LONG);
    return 0;
  }

  return 1;
}